

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNla.cpp
# Opt level: O2

void __thiscall HSimplexNla::unapplyBasisMatrixRowScale(HSimplexNla *this,HVector *rhs)

{
  uint uVar1;
  uint uVar2;
  HighsScale *pHVar3;
  pointer piVar4;
  pointer pdVar5;
  bool bVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  
  pHVar3 = this->scale_;
  if (pHVar3 != (HighsScale *)0x0) {
    uVar1 = rhs->count;
    uVar2 = this->lp_->num_row_;
    bVar6 = (double)(int)uVar2 * 0.4 <= (double)(int)uVar1;
    if (!bVar6 && (int)uVar1 >= 0) {
      uVar2 = uVar1;
    }
    piVar4 = (rhs->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (rhs->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = 0;
    uVar7 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar7 = uVar9;
    }
    for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
      if (bVar6 || (int)uVar1 < 0) {
        iVar8 = (int)uVar9;
      }
      else {
        iVar8 = piVar4[uVar9];
      }
      pdVar5[iVar8] =
           pdVar5[iVar8] /
           (pHVar3->row).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[iVar8];
    }
  }
  return;
}

Assistant:

void HSimplexNla::unapplyBasisMatrixRowScale(HVector& rhs) const {
  if (scale_ == NULL) return;
  const vector<double>& row_scale = scale_->row;
  HighsInt to_entry;
  const bool use_row_indices =
      sparseLoopStyle(rhs.count, lp_->num_row_, to_entry);
  for (HighsInt iEntry = 0; iEntry < to_entry; iEntry++) {
    const HighsInt iRow = use_row_indices ? rhs.index[iEntry] : iEntry;
    rhs.array[iRow] /= row_scale[iRow];
  }
}